

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupByState.hpp
# Opt level: O3

void __thiscall
linq::IGrouping<bool,_int_&>::IGrouping
          (IGrouping<bool,_int_&> *this,bool key,shared_ptr<linq::IState<int_&>_> *state)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  
  peVar1 = (state->super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (state->super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
            ._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (this->super_IEnumerable<int_&>).state.
    super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (this->super_IEnumerable<int_&>).state.
    super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_0011a26d;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
    bVar2 = __libc_single_threaded != '\0';
    (this->super_IEnumerable<int_&>).super_IState<int_&>._vptr_IState =
         (_func_int **)&PTR_Init_00157638;
    (this->super_IEnumerable<int_&>).state.
    super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (this->super_IEnumerable<int_&>).state.
    super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
    if (bVar2) goto LAB_0011a265;
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
    (this->super_IEnumerable<int_&>).super_IState<int_&>._vptr_IState =
         (_func_int **)&PTR_Init_00157638;
    (this->super_IEnumerable<int_&>).state.
    super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (this->super_IEnumerable<int_&>).state.
    super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
LAB_0011a265:
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
LAB_0011a26d:
  (this->super_IEnumerable<int_&>).super_IState<int_&>._vptr_IState =
       (_func_int **)&PTR_Init_001576d0;
  this->Key = key;
  return;
}

Assistant:

IGrouping(KEY key, IState<VALUE>* state) : Key(key), IEnumerable<VALUE>(state) {}